

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Image * read_png_file(char *filename)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint *h;
  byte bVar1;
  uint uVar2;
  Image *w;
  ostream *poVar3;
  char *pcVar4;
  uchar *puVar5;
  int y;
  ulong uVar6;
  uchar uVar7;
  int x;
  uint uVar8;
  allocator local_279;
  vector<unsigned_char,_std::allocator<unsigned_char>_> png;
  string local_260;
  State state;
  
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  w = (Image *)operator_new(0x50);
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lodepng::State::State(&state);
  std::__cxx11::string::string((string *)&local_260,filename,&local_279);
  uVar2 = lodepng::load_file(&png,&local_260);
  this = &w->pixels;
  std::__cxx11::string::~string((string *)&local_260);
  if (uVar2 == 0) {
    h = &w->height;
    uVar2 = lodepng_inspect((uint *)w,h,&state.super_LodePNGState,
                            png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)png.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)png.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    if (uVar2 != 0) goto LAB_00112ab7;
    if (state.super_LodePNGState.info_png.color.colortype == LCT_PALETTE) {
      if (4 < state.super_LodePNGState.info_png.color.bitdepth) {
        puts("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.");
      }
      state.super_LodePNGState.info_raw.colortype = LCT_PALETTE;
      state.super_LodePNGState.info_raw.bitdepth = 8;
      uVar2 = lodepng::decode(this,(uint *)w,h,&state,&png);
      if (uVar2 == 0) {
        for (uVar2 = 0; uVar2 < *h; uVar2 = uVar2 + 1) {
          uVar6 = 0;
          while( true ) {
            uVar8 = (uint)uVar6;
            if (w->width <= uVar8) break;
            bVar1 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[w->width * uVar2 + uVar8];
            if (0xf < bVar1) {
              printf("Warning: color palette index[%d] used at pixel(%d,%d).\n",(ulong)bVar1,uVar6,
                     (ulong)uVar2);
              (w->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[w->width * uVar2 + uVar8] = '\0';
            }
            uVar6 = (ulong)(uVar8 + 1);
          }
        }
        puVar5 = &w->palette[0].blue;
        for (uVar6 = 0; uVar6 != 0x10; uVar6 = uVar6 + 1) {
          if (uVar6 < state.super_LodePNGState.info_png.color.palettesize) {
            ((Color *)(puVar5 + -2))->red =
                 state.super_LodePNGState.info_png.color.palette[uVar6 * 4];
            puVar5[-1] = state.super_LodePNGState.info_png.color.palette[uVar6 * 4 + 1];
            uVar7 = state.super_LodePNGState.info_png.color.palette[uVar6 * 4 + 2];
          }
          else {
            ((Color *)(puVar5 + -2))->red = '\0';
            ((Color *)(puVar5 + -2))->green = '\0';
            uVar7 = '\0';
          }
          *puVar5 = uVar7;
          puVar5 = puVar5 + 3;
        }
        goto LAB_00112b12;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"[read_png_file] decoder error ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,": ");
      pcVar4 = lodepng_error_text(uVar2);
      goto LAB_00112aed;
    }
    puts("[read_png_file] Only indexed PNG files allowed");
  }
  else {
LAB_00112ab7:
    poVar3 = std::operator<<((ostream *)&std::cout,"[read_png_file] error reading file ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,": ");
    pcVar4 = lodepng_error_text(uVar2);
LAB_00112aed:
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  operator_delete(w);
  w = (Image *)0x0;
LAB_00112b12:
  lodepng::State::~State(&state);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&png.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return w;
}

Assistant:

Image *read_png_file(const char *filename) {
    std::vector<unsigned char> png;
    Image *image = new Image;
    lodepng::State state;

    unsigned error = lodepng::load_file(png, filename);
    if (!error) error = lodepng_inspect(&image->width, &image->height, &state, &png[0], png.size());
    if (error) {
        std::cout << "[read_png_file] error reading file " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    if (state.info_png.color.colortype != LCT_PALETTE) {
        printf("[read_png_file] Only indexed PNG files allowed\n");
        delete image;
        return nullptr;
    }

    if (state.info_png.color.bitdepth > 4) {
        printf("[read_png_file] PNG bit depth > 4. Only the first 16 colours will be used.\n");
    }

    state.info_raw.colortype = LCT_PALETTE;
    state.info_raw.bitdepth = 8;


    if(!error) error = lodepng::decode(image->pixels, image->width, image->height, state, png);
    if (error) {
        std::cout << "[read_png_file] decoder error " << error << ": "<< lodepng_error_text(error) << std::endl;
        delete image;
        return nullptr;
    }

    // Remove all colors after the first 16 palette entries.
    for (int y = 0; y < image->height; y++) {
        for (int x = 0; x < image->width; x++) {
            if (image->pixels[x + y * image->width] >= MAX_COLOURS) {
                printf("Warning: color palette index[%d] used at pixel(%d,%d).\n", image->pixels[x + y * image->width], x, y);
                image->pixels[x + y * image->width] = 0;
            }
        }
    }

    for(int i = 0; i < MAX_COLOURS; i++) {
        if (i < state.info_png.color.palettesize) {
            image->palette[i].red = state.info_png.color.palette[i * 4];
            image->palette[i].green = state.info_png.color.palette[i * 4 + 1];
            image->palette[i].blue = state.info_png.color.palette[i * 4 + 2];
        } else {
            image->palette[i].red   = 0;
            image->palette[i].green = 0;
            image->palette[i].blue  = 0;
        }
    }
    return image;
}